

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::
str<kj::Repeat<char>,char_const*&,char_const(&)[2],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String,char>
          (String *__return_storage_ptr__,kj *this,Repeat<char> *params,char **params_1,
          char (*params_2) [2],int *params_3,char (*params_4) [3],LogSeverity *params_5,
          char (*params_6) [3],String *params_7,char *params_8)

{
  char *pcVar1;
  size_t sVar2;
  FixedArray<char,_1UL> *in_stack_ffffffffffffff38;
  undefined1 local_b9 [9];
  size_t local_b0;
  ArrayPtr<const_char> local_a8;
  undefined1 local_98 [16];
  ArrayPtr<const_char> local_88;
  char *local_78;
  size_t local_70;
  kj local_68 [8];
  undefined8 local_60;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_68[0] = *this;
  local_60 = *(undefined8 *)(this + 8);
  pcVar1 = *(char **)params;
  local_70 = strlen(pcVar1);
  local_78 = pcVar1;
  local_88.size_ = strlen((char *)params_1);
  local_88.ptr = (char *)params_1;
  _::Stringifier::operator*(&local_48,(Stringifier *)&_::STR,*(int *)params_2);
  local_98._8_8_ = strlen((char *)params_3);
  pcVar1 = operator*::SEVERITY_STRINGS[*(uint *)params_4];
  local_98._0_8_ = params_3;
  sVar2 = strlen(pcVar1);
  local_a8.size_ = sVar2 + 1;
  local_a8.ptr = pcVar1;
  local_b0 = strlen((char *)params_5);
  local_b9._1_8_ = params_5;
  pcVar1 = *(char **)(params_6[2] + 2);
  local_58.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_58.ptr = *(char **)params_6;
  }
  local_58.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_58.size_ = (size_t)(pcVar1 + -1);
  }
  local_b9[0] = *(undefined1 *)&(params_7->content).ptr;
  _::
  concat<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)local_68,(Repeat<char> *)&local_78,&local_88,
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)local_98,&local_a8,
             (StringPtr *)(local_b9 + 1),&local_58,(ArrayPtr<const_char> *)local_b9,
             in_stack_ffffffffffffff38);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}